

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
lower_upper_bound_dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this)

{
  type_conflict4 tVar1;
  reference other;
  int *piVar2;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
  local_a0;
  int local_94;
  int sh_dimension;
  Simplex_handle sh;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  __end0;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  __begin0;
  Complex_simplex_range *__range2;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *pSStack_18;
  int new_dimension;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this_local;
  
  this->dimension_to_be_lowered_ = false;
  __range2._4_4_ = -1;
  pSStack_18 = this;
  complex_simplex_range((Complex_simplex_range *)&__begin0.st_,this);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
           *)&__end0.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
         *)&sh,(iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                *)&__begin0.st_);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&sh);
    if (!tVar1) {
      this->dimension_ = __range2._4_4_;
      return true;
    }
    other = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                         *)&__end0.st_);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                    *)&stack0xffffffffffffff70,other);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_a0,
                   (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                    *)&stack0xffffffffffffff70);
    local_94 = dimension(this,&local_a0);
    if (this->dimension_ <= local_94) break;
    piVar2 = std::max<int>((int *)((long)&__range2 + 4),&local_94);
    __range2._4_4_ = *piVar2;
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                  *)&__end0.st_);
  }
  return false;
}

Assistant:

bool lower_upper_bound_dimension() const {
    // reset automatic detection to recompute
    dimension_to_be_lowered_ = false;
    int new_dimension = -1;
    // Browse the tree from the left to the right as higher dimension cells are more likely on the left part of the tree
    for (Simplex_handle sh : complex_simplex_range()) {
#ifdef DEBUG_TRACES
      for (auto vertex : simplex_vertex_range(sh)) {
        std::clog << " " << vertex;
      }
      std::clog << std::endl;
#endif  // DEBUG_TRACES

      int sh_dimension = dimension(sh);
      if (sh_dimension >= dimension_)
        // Stop browsing as soon as the dimension is reached, no need to go further
        return false;
      new_dimension = (std::max)(new_dimension, sh_dimension);
    }
    dimension_ = new_dimension;
    return true;
  }